

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_reduce_2k_setup(mp_int *a,mp_digit *d)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int b;
  mp_digit *__ptr;
  mp_int local_38;
  
  local_38.dp = (mp_digit *)malloc(0x100);
  if (local_38.dp == (mp_digit *)0x0) {
    return -2;
  }
  memset(local_38.dp,0,0x100);
  local_38.used = 0;
  local_38.alloc = 0x20;
  local_38.sign = 0;
  iVar3 = a->used;
  if ((long)iVar3 == 0) {
    b = 0;
  }
  else {
    b = (iVar3 + -1) * 0x3c;
    uVar1 = a->dp[(long)iVar3 + -1];
    if (uVar1 != 0) {
      lVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      b = (b - ((uint)lVar2 ^ 0x3f)) + 0x40;
    }
  }
  iVar3 = mp_2expt(&local_38,b);
  __ptr = local_38.dp;
  if (iVar3 == 0) {
    iVar3 = s_mp_sub(&local_38,a,&local_38);
    __ptr = local_38.dp;
    if (iVar3 == 0) {
      *d = *local_38.dp;
      if (0 < (long)local_38.used) {
        memset(local_38.dp,0,(long)local_38.used << 3);
      }
      free(__ptr);
      return 0;
    }
    if (local_38.dp == (mp_digit *)0x0) {
      return iVar3;
    }
    if (0 < (long)local_38.used) {
      memset(local_38.dp,0,(long)local_38.used << 3);
    }
  }
  else {
    if (local_38.dp == (mp_digit *)0x0) {
      return iVar3;
    }
    if (0 < (long)local_38.used) {
      memset(local_38.dp,0,(long)local_38.used << 3);
    }
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int mp_reduce_2k_setup(mp_int *a, mp_digit *d)
{
   int res, p;
   mp_int tmp;
   
   if ((res = mp_init(&tmp)) != MP_OKAY) {
      return res;
   }
   
   p = mp_count_bits(a);
   if ((res = mp_2expt(&tmp, p)) != MP_OKAY) {
      mp_clear(&tmp);
      return res;
   }
   
   if ((res = s_mp_sub(&tmp, a, &tmp)) != MP_OKAY) {
      mp_clear(&tmp);
      return res;
   }
   
   *d = tmp.dp[0];
   mp_clear(&tmp);
   return MP_OKAY;
}